

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_pin_peer_pubkey(Curl_easy *data,char *pinnedpubkey,uchar *pubkey,size_t pubkeylen)

{
  curl_trc_feat *pcVar1;
  int iVar2;
  CURLcode CVar3;
  CURLcode CVar4;
  FILE *__stream;
  uchar *inputbuff;
  ulong sonum;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char *__haystack;
  size_t sVar9;
  char *pcVar10;
  uchar *pem_ptr;
  dynbuf buf;
  size_t pem_len;
  char buffer [1024];
  uchar *local_470;
  dynbuf local_468;
  size_t local_448;
  size_t local_440;
  size_t local_438 [129];
  
  if (pinnedpubkey == (char *)0x0) {
    CVar3 = CURLE_OK;
  }
  else {
    CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
    if (pubkeylen != 0 && pubkey != (uchar *)0x0) {
      iVar2 = strncmp(pinnedpubkey,"sha256//",8);
      if (iVar2 == 0) {
        local_438[0] = 0;
        local_468.bufr = (char *)0x0;
        if (Curl_ssl->sha256sum == (_func_CURLcode_uchar_ptr_size_t_uchar_ptr_size_t *)0x0) {
          CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        }
        else {
          inputbuff = (uchar *)(*Curl_cmalloc)(0x20);
          CVar3 = CURLE_OUT_OF_MEMORY;
          if (inputbuff != (uchar *)0x0) {
            CVar3 = (*Curl_ssl->sha256sum)(pubkey,pubkeylen,inputbuff,0x20);
            if (CVar3 == CURLE_OK) {
              CVar3 = Curl_base64_encode((char *)inputbuff,0x20,&local_468.bufr,local_438);
              (*Curl_cfree)(inputbuff);
              if (CVar3 == CURLE_OK) {
                if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                   ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                    (0 < pcVar1->log_level)))) {
                  Curl_infof(data," public key hash: sha256//%s",local_468.bufr);
                }
                pcVar8 = (*Curl_cstrdup)(pinnedpubkey);
                pcVar7 = pcVar8;
                if (pcVar8 == (char *)0x0) {
                  (*Curl_cfree)(local_468.bufr);
                  CVar3 = CURLE_OUT_OF_MEMORY;
                }
                else {
                  do {
                    __haystack = strstr(pcVar7,";sha256//");
                    sVar5 = local_438[0];
                    if (__haystack == (char *)0x0) {
                      sVar9 = strlen(pcVar7 + 8);
                      if (sVar5 != sVar9) break;
LAB_0017275f:
                      pcVar10 = local_468.bufr;
                      iVar2 = bcmp(local_468.bufr,pcVar7 + 8,sVar5);
                      if ((__haystack == (char *)0x0) || (iVar2 == 0)) {
                        CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
                        if (iVar2 == 0) {
                          CVar3 = CURLE_OK;
                        }
                        goto LAB_00172807;
                      }
                    }
                    else {
                      *__haystack = '\0';
                      sVar9 = strlen(pcVar7 + 8);
                      if (sVar5 == sVar9) goto LAB_0017275f;
                    }
                    *__haystack = ';';
                    pcVar7 = strstr(__haystack,"sha256//");
                  } while (pcVar7 != (char *)0x0);
                  CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
                  pcVar10 = local_468.bufr;
LAB_00172807:
                  (*Curl_cfree)(pcVar10);
                  local_468.bufr = (char *)0x0;
                  (*Curl_cfree)(pcVar8);
                }
              }
            }
            else {
              (*Curl_cfree)(inputbuff);
            }
          }
        }
      }
      else {
        local_470 = (uchar *)0x0;
        __stream = fopen64(pinnedpubkey,"rb");
        if (__stream != (FILE *)0x0) {
          Curl_dyn_init(&local_468,0x100000);
          iVar2 = fseek(__stream,0,2);
          CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          if (iVar2 == 0) {
            sonum = ftell(__stream);
            iVar2 = fseek(__stream,0,0);
            if (((sonum < 0x100001) && (iVar2 == 0)) &&
               (sVar5 = curlx_sotouz(sonum), pubkeylen <= sVar5)) {
              local_448 = sVar5;
              do {
                sVar9 = 0x400;
                if (sVar5 < 0x400) {
                  sVar9 = sVar5;
                }
                sVar6 = fread(local_438,1,sVar9,__stream);
                if ((sVar9 != sVar6) ||
                   (CVar4 = Curl_dyn_addn(&local_468,local_438,sVar9), CVar4 != CURLE_OK))
                goto LAB_00172506;
                sVar5 = sVar5 - sVar9;
              } while (sVar5 != 0);
              pcVar7 = Curl_dyn_ptr(&local_468);
              if (local_448 == pubkeylen) {
                iVar2 = bcmp(pubkey,pcVar7,pubkeylen);
                CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
                if (iVar2 == 0) {
                  CVar3 = CURLE_OK;
                }
              }
              else {
                CVar4 = pubkey_pem_to_der(pcVar7,&local_470,&local_440);
                if ((CVar4 == CURLE_OK) && (local_440 == pubkeylen)) {
                  iVar2 = bcmp(pubkey,local_470,pubkeylen);
                  CVar3 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
                  if (iVar2 == 0) {
                    CVar3 = CURLE_OK;
                  }
                }
              }
            }
          }
LAB_00172506:
          Curl_dyn_free(&local_468);
          (*Curl_cfree)(local_470);
          local_470 = (uchar *)0x0;
          fclose(__stream);
        }
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_pin_peer_pubkey(struct Curl_easy *data,
                              const char *pinnedpubkey,
                              const unsigned char *pubkey, size_t pubkeylen)
{
  CURLcode result = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* if a path was not specified, do not pin */
  if(!pinnedpubkey)
    return CURLE_OK;
  if(!pubkey || !pubkeylen)
    return result;

  /* only do this if pinnedpubkey starts with "sha256//", length 8 */
  if(!strncmp(pinnedpubkey, "sha256//", 8)) {
    CURLcode encode;
    size_t encodedlen = 0;
    char *encoded = NULL, *pinkeycopy, *begin_pos, *end_pos;
    unsigned char *sha256sumdigest;

    if(!Curl_ssl->sha256sum) {
      /* without sha256 support, this cannot match */
      return result;
    }

    /* compute sha256sum of public key */
    sha256sumdigest = malloc(CURL_SHA256_DIGEST_LENGTH);
    if(!sha256sumdigest)
      return CURLE_OUT_OF_MEMORY;
    encode = Curl_ssl->sha256sum(pubkey, pubkeylen,
                                 sha256sumdigest, CURL_SHA256_DIGEST_LENGTH);

    if(!encode)
      encode = Curl_base64_encode((char *)sha256sumdigest,
                                  CURL_SHA256_DIGEST_LENGTH, &encoded,
                                  &encodedlen);
    Curl_safefree(sha256sumdigest);

    if(encode)
      return encode;

    infof(data, " public key hash: sha256//%s", encoded);

    /* it starts with sha256//, copy so we can modify it */
    pinkeycopy = strdup(pinnedpubkey);
    if(!pinkeycopy) {
      Curl_safefree(encoded);
      return CURLE_OUT_OF_MEMORY;
    }
    /* point begin_pos to the copy, and start extracting keys */
    begin_pos = pinkeycopy;
    do {
      end_pos = strstr(begin_pos, ";sha256//");
      /*
       * if there is an end_pos, null terminate,
       * otherwise it will go to the end of the original string
       */
      if(end_pos)
        end_pos[0] = '\0';

      /* compare base64 sha256 digests, 8 is the length of "sha256//" */
      if(encodedlen == strlen(begin_pos + 8) &&
         !memcmp(encoded, begin_pos + 8, encodedlen)) {
        result = CURLE_OK;
        break;
      }

      /*
       * change back the null-terminator we changed earlier,
       * and look for next begin
       */
      if(end_pos) {
        end_pos[0] = ';';
        begin_pos = strstr(end_pos, "sha256//");
      }
    } while(end_pos && begin_pos);
    Curl_safefree(encoded);
    Curl_safefree(pinkeycopy);
  }
  else {
    long filesize;
    size_t size, pem_len;
    CURLcode pem_read;
    struct dynbuf buf;
    char unsigned *pem_ptr = NULL;
    size_t left;
    FILE *fp = fopen(pinnedpubkey, "rb");
    if(!fp)
      return result;

    Curl_dyn_init(&buf, MAX_PINNED_PUBKEY_SIZE);

    /* Determine the file's size */
    if(fseek(fp, 0, SEEK_END))
      goto end;
    filesize = ftell(fp);
    if(fseek(fp, 0, SEEK_SET))
      goto end;
    if(filesize < 0 || filesize > MAX_PINNED_PUBKEY_SIZE)
      goto end;

    /*
     * if the size of our certificate is bigger than the file
     * size then it cannot match
     */
    size = curlx_sotouz((curl_off_t) filesize);
    if(pubkeylen > size)
      goto end;

    /*
     * Read the file into the dynbuf
     */
    left = size;
    do {
      char buffer[1024];
      size_t want = left > sizeof(buffer) ? sizeof(buffer) : left;
      if(want != fread(buffer, 1, want, fp))
        goto end;
      if(Curl_dyn_addn(&buf, buffer, want))
        goto end;
      left -= want;
    } while(left);

    /* If the sizes are the same, it cannot be base64 encoded, must be der */
    if(pubkeylen == size) {
      if(!memcmp(pubkey, Curl_dyn_ptr(&buf), pubkeylen))
        result = CURLE_OK;
      goto end;
    }

    /*
     * Otherwise we will assume it is PEM and try to decode it
     * after placing null terminator
     */
    pem_read = pubkey_pem_to_der(Curl_dyn_ptr(&buf), &pem_ptr, &pem_len);
    /* if it was not read successfully, exit */
    if(pem_read)
      goto end;

    /*
     * if the size of our certificate does not match the size of
     * the decoded file, they cannot be the same, otherwise compare
     */
    if(pubkeylen == pem_len && !memcmp(pubkey, pem_ptr, pubkeylen))
      result = CURLE_OK;
end:
    Curl_dyn_free(&buf);
    Curl_safefree(pem_ptr);
    fclose(fp);
  }

  return result;
}